

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

bool testing::internal::TuplePrefix<3ul>::
     Matches<std::tuple<testing::Matcher<solitaire::graphics::TextureId>,testing::Matcher<solitaire::geometry::Position_const&>,testing::Matcher<solitaire::geometry::Area_const&>>,std::tuple<solitaire::graphics::TextureId,solitaire::geometry::Position_const&,solitaire::geometry::Area_const&>>
               (tuple<testing::Matcher<solitaire::graphics::TextureId>,_testing::Matcher<const_solitaire::geometry::Position_&>,_testing::Matcher<const_solitaire::geometry::Area_&>_>
                *matcher_tuple,
               tuple<solitaire::graphics::TextureId,_const_solitaire::geometry::Position_&,_const_solitaire::geometry::Area_&>
               *value_tuple)

{
  bool bVar1;
  
  bVar1 = TuplePrefix<2ul>::
          Matches<std::tuple<testing::Matcher<solitaire::graphics::TextureId>,testing::Matcher<solitaire::geometry::Position_const&>,testing::Matcher<solitaire::geometry::Area_const&>>,std::tuple<solitaire::graphics::TextureId,solitaire::geometry::Position_const&,solitaire::geometry::Area_const&>>
                    (matcher_tuple,value_tuple);
  if (bVar1) {
    bVar1 = MatcherBase<const_solitaire::geometry::Area_&>::Matches
                      ((MatcherBase<const_solitaire::geometry::Area_&> *)matcher_tuple,
                       (value_tuple->
                       super__Tuple_impl<0UL,_solitaire::graphics::TextureId,_const_solitaire::geometry::Position_&,_const_solitaire::geometry::Area_&>
                       ).
                       super__Tuple_impl<1UL,_const_solitaire::geometry::Position_&,_const_solitaire::geometry::Area_&>
                       .super__Tuple_impl<2UL,_const_solitaire::geometry::Area_&>.
                       super__Head_base<2UL,_const_solitaire::geometry::Area_&,_false>._M_head_impl)
    ;
    return bVar1;
  }
  return false;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple) &&
           std::get<N - 1>(matcher_tuple).Matches(std::get<N - 1>(value_tuple));
  }